

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_socket.c
# Opt level: O0

cio_error cio_server_socket_init
                    (cio_server_socket *server_socket,cio_eventloop *loop,uint backlog,
                    cio_address_family family,cio_alloc_client_t alloc_client,
                    cio_free_client_t free_client,uint64_t close_timeout_ns,
                    cio_server_socket_close_hook_t close_hook)

{
  int iVar1;
  int *piVar2;
  int listen_fd;
  cio_free_client_t free_client_local;
  cio_alloc_client_t alloc_client_local;
  cio_address_family family_local;
  uint backlog_local;
  cio_eventloop *loop_local;
  cio_server_socket *server_socket_local;
  
  iVar1 = cio_linux_socket_create(family);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    server_socket_local._4_4_ = -*piVar2;
  }
  else {
    (server_socket->impl).ev.fd = iVar1;
    (server_socket->impl).close_timeout_ns = close_timeout_ns;
    server_socket->alloc_client = alloc_client;
    server_socket->free_client = free_client;
    (server_socket->impl).loop = loop;
    server_socket->close_hook = close_hook;
    server_socket->backlog = backlog;
    server_socket_local._4_4_ = CIO_SUCCESS;
  }
  return server_socket_local._4_4_;
}

Assistant:

enum cio_error cio_server_socket_init(struct cio_server_socket *server_socket,
                                      struct cio_eventloop *loop,
                                      unsigned int backlog,
                                      enum cio_address_family family,
                                      cio_alloc_client_t alloc_client,
                                      cio_free_client_t free_client,
                                      uint64_t close_timeout_ns,
                                      cio_server_socket_close_hook_t close_hook)
{
	int listen_fd = cio_linux_socket_create(family);
	if (cio_unlikely(listen_fd == -1)) {
		return (enum cio_error)(-errno);
	}

	server_socket->impl.ev.fd = listen_fd;
	server_socket->impl.close_timeout_ns = close_timeout_ns;

	server_socket->alloc_client = alloc_client;
	server_socket->free_client = free_client;
	server_socket->impl.loop = loop;
	server_socket->close_hook = close_hook;
	server_socket->backlog = (int)backlog;
	return CIO_SUCCESS;
}